

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharedRenderingPerfTests.cpp
# Opt level: O3

IterateResult __thiscall
deqp::egl::anon_unknown_0::SharedRenderingPerfCase::iterate(SharedRenderingPerfCase *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  iterator __position;
  TestContext *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  bool *pbVar3;
  pointer puVar4;
  pointer __dest;
  TestContext *pTVar5;
  pointer ppTVar6;
  pointer ppTVar7;
  deUint64 dVar8;
  glBeginConditionalRenderFunc p_Var9;
  glBeginQueryFunc p_Var10;
  glActiveTextureFunc p_Var11;
  glAttachShaderFunc p_Var12;
  deUint64 dVar13;
  SampleBuilder *this_01;
  ulong uVar14;
  uint uVar15;
  pointer puVar16;
  int precision;
  ulong uVar17;
  IterateResult IVar18;
  _Vector_base<deqp::egl::(anonymous_namespace)::TestContext_*,_std::allocator<deqp::egl::(anonymous_namespace)::TestContext_*>_>
  *this_02;
  int iVar19;
  long lVar20;
  pointer in_RSI;
  char *pcVar21;
  unsigned_long *puVar22;
  int threadNdx;
  long lVar23;
  int iVar24;
  pointer ppTVar25;
  pointer ppTVar26;
  pointer __n;
  undefined8 uVar27;
  int iVar28;
  ulong uVar29;
  bool bVar30;
  double dVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  vector<unsigned_long,_std::allocator<unsigned_long>_> resultsUs;
  ScopedLogSection threadSection;
  size_type __dnew_1;
  size_type __dnew;
  pointer local_310;
  pointer local_2f8;
  pointer local_2e8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_2c8;
  ulong local_2b0;
  pointer local_2a8;
  int local_29c;
  ulong local_298;
  string local_290;
  LogSampleList local_270;
  undefined1 local_230 [8];
  pointer local_228;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_220;
  string local_210;
  string local_1f0;
  qpSampleValueTag local_1d0;
  ios_base local_1b8 [264];
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  if ((this->m_results).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start ==
      (this->m_results).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    aStack_220._M_allocated_capacity = 0x666e692074736554;
    aStack_220._8_2_ = 0x6f;
    local_228 = (pointer)0x9;
    paVar2 = &local_270.m_name.field_2;
    local_b0._M_dataplus._M_p = &DAT_00000010;
    local_270.m_name._M_dataplus._M_p = (pointer)paVar2;
    local_230 = (undefined1  [8])&aStack_220;
    local_270.m_name._M_dataplus._M_p =
         (pointer)std::__cxx11::string::_M_create((ulong *)&local_270,(ulong)&local_b0);
    local_270.m_name.field_2._M_allocated_capacity = (size_type)local_b0._M_dataplus._M_p;
    builtin_strncpy(local_270.m_name._M_dataplus._M_p,"Test information",0x10);
    local_270.m_name._M_string_length = (size_type)local_b0._M_dataplus._M_p;
    local_270.m_name._M_dataplus._M_p[(long)local_b0._M_dataplus._M_p] = '\0';
    tcu::ScopedLogSection::ScopedLogSection
              ((ScopedLogSection *)&local_290,(TestLog *)&paVar1->_M_allocated_capacity,
               (string *)local_230,&local_270.m_name);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_270.m_name._M_dataplus._M_p != paVar2) {
      operator_delete(local_270.m_name._M_dataplus._M_p,
                      (ulong)(local_270.m_name.field_2._M_allocated_capacity + 1));
    }
    if (local_230 != (undefined1  [8])&aStack_220) {
      operator_delete((void *)local_230,aStack_220._M_allocated_capacity + 1);
    }
    local_230 = (undefined1  [8])paVar1;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_228);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_228,"Total triangles rendered: : ",0x1c);
    std::ostream::operator<<
              ((ostringstream *)&local_228,
               (this->m_config).drawCallCount * (this->m_config).triangleCount *
               (this->m_config).frameCount * (this->m_config).perThreadContextCount *
               (this->m_config).threadCount);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_230,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_228);
    std::ios_base::~ios_base(local_1b8);
    local_230 = (undefined1  [8])paVar1;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_228);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_228,"Number of threads: ",0x13);
    std::ostream::operator<<((ostringstream *)&local_228,(this->m_config).threadCount);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_230,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_228);
    std::ios_base::~ios_base(local_1b8);
    local_230 = (undefined1  [8])paVar1;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_228);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_228,"Number of contexts used to render with each thread: ",0x34);
    std::ostream::operator<<((ostringstream *)&local_228,(this->m_config).perThreadContextCount);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_230,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_228);
    std::ios_base::~ios_base(local_1b8);
    local_230 = (undefined1  [8])paVar1;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_228);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_228,"Number of frames rendered with each context: ",0x2d);
    std::ostream::operator<<((ostringstream *)&local_228,(this->m_config).frameCount);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_230,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_228);
    std::ios_base::~ios_base(local_1b8);
    local_230 = (undefined1  [8])paVar1;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_228);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_228,"Number of draw calls performed by each frame: ",0x2e);
    std::ostream::operator<<((ostringstream *)&local_228,(this->m_config).drawCallCount);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_230,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_228);
    std::ios_base::~ios_base(local_1b8);
    local_230 = (undefined1  [8])paVar1;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_228);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_228,"Number of triangles rendered by each draw call: ",0x30);
    std::ostream::operator<<((ostringstream *)&local_228,(this->m_config).triangleCount);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_230,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_228);
    std::ios_base::~ios_base(local_1b8);
    if ((this->m_config).sharedContexts == true) {
      local_230 = (undefined1  [8])paVar1;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_228);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_228,"Shared contexts.",0x10);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_230,(EndMessageToken *)&tcu::TestLog::EndMessage);
    }
    else {
      local_230 = (undefined1  [8])paVar1;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_228);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_228,"No shared contexts.",0x13);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_230,(EndMessageToken *)&tcu::TestLog::EndMessage);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_228);
    std::ios_base::~ios_base(local_1b8);
    if ((this->m_config).useCoordBuffer == true) {
      local_230 = (undefined1  [8])paVar1;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_228);
      pcVar21 = ::glcts::fixed_sample_locations_values + 1;
      bVar30 = (this->m_config).sharedCoordBuffer != false;
      if (bVar30) {
        pcVar21 = "Shared ";
      }
      lVar20 = 7;
      if (!bVar30) {
        lVar20 = 0;
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_228,pcVar21,lVar20);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_228,"Coordinate buffer",0x11);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_230,(EndMessageToken *)&tcu::TestLog::EndMessage);
    }
    else {
      local_230 = (undefined1  [8])paVar1;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_228);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_228,"Coordinates from pointer",0x18);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_230,(EndMessageToken *)&tcu::TestLog::EndMessage);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_228);
    std::ios_base::~ios_base(local_1b8);
    if ((this->m_config).useIndices == true) {
      local_230 = (undefined1  [8])paVar1;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_228);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_228,"Using glDrawElements with indices from ",0x27);
      pbVar3 = ::glcts::fixed_sample_locations_values;
      bVar30 = (this->m_config).sharedIndexBuffer != false;
      if (bVar30) {
        pbVar3 = (bool *)" shared ";
      }
      lVar20 = 7;
      if (!bVar30) {
        lVar20 = 0;
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_228,pbVar3 + 1,lVar20);
      uVar29 = (ulong)(this->m_config).useIndexBuffer;
      pcVar21 = "pointer.";
      if (uVar29 != 0) {
        pcVar21 = "buffer.";
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_228,pcVar21,8 - uVar29);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_230,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_228);
      std::ios_base::~ios_base(local_1b8);
    }
    if ((this->m_config).useTexture == true) {
      switch((this->m_config).textureType) {
      case TEXTURETYPE_TEXTURE:
        local_230 = (undefined1  [8])paVar1;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_228);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_228,"Use texture.",0xc)
        ;
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_230,(EndMessageToken *)&tcu::TestLog::EndMessage);
        break;
      case TEXTURETYPE_SHARED_TEXTURE:
        local_230 = (undefined1  [8])paVar1;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_228);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_228,"Use shared texture.",0x13);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_230,(EndMessageToken *)&tcu::TestLog::EndMessage);
        break;
      case TEXTURETYPE_IMAGE:
        local_230 = (undefined1  [8])paVar1;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_228);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_228,"Use texture created from EGLImage.",0x22);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_230,(EndMessageToken *)&tcu::TestLog::EndMessage);
        break;
      case TEXTURETYPE_SHARED_IMAGE:
        local_230 = (undefined1  [8])paVar1;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_228);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_228,"Use texture created from shared EGLImage.",0x29);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_230,(EndMessageToken *)&tcu::TestLog::EndMessage);
        break;
      case TEXTURETYPE_SHARED_IMAGE_TEXTURE:
        local_230 = (undefined1  [8])paVar1;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_228);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_228,"Use shared texture created from EGLImage.",0x29);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_230,(EndMessageToken *)&tcu::TestLog::EndMessage);
        break;
      default:
        goto switchD_00e29b59_default;
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_228);
      std::ios_base::~ios_base(local_1b8);
switchD_00e29b59_default:
      local_230 = (undefined1  [8])paVar1;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_228);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_228,"Texture size: ",0xe)
      ;
      std::ostream::operator<<((ostringstream *)&local_228,(this->m_config).textureWidth);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_228,"x",1);
      std::ostream::operator<<((ostringstream *)&local_228,(this->m_config).textureHeight);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_230,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_228);
      std::ios_base::~ios_base(local_1b8);
    }
    if ((this->m_config).sharedProgram == true) {
      local_230 = (undefined1  [8])paVar1;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_228);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_228,"Shared program.",0xf);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_230,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_228);
      std::ios_base::~ios_base(local_1b8);
    }
    local_230 = (undefined1  [8])paVar1;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_228);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_228,"Surface size: ",0xe);
    std::ostream::operator<<((ostringstream *)&local_228,(this->m_config).surfaceWidth);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_228,"x",1);
    std::ostream::operator<<((ostringstream *)&local_228,(this->m_config).surfaceHeight);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_230,(EndMessageToken *)&tcu::TestLog::EndMessage);
    in_RSI = (pointer)&std::__cxx11::ostringstream::VTT;
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_228);
    std::ios_base::~ios_base(local_1b8);
    tcu::TestLog::endSection((TestLog *)local_290._M_dataplus._M_p);
  }
  local_29c = (this->m_config).threadCount;
  if (local_29c < 1) {
    local_310 = (pointer)0x0;
    ppTVar26 = (pointer)0x0;
    local_2f8 = (pointer)0x0;
  }
  else {
    uVar29 = (ulong)(uint)(this->m_config).perThreadContextCount;
    iVar28 = 0;
    local_310 = (pointer)0x0;
    ppTVar26 = (pointer)0x0;
    local_2f8 = (pointer)0x0;
    iVar24 = 0;
    local_2e8 = (pointer)0x0;
    ppTVar25 = (pointer)0x0;
    local_298 = uVar29;
    do {
      ppTVar6 = ppTVar25;
      __dest = ppTVar25;
      iVar19 = iVar28;
      local_2a8 = ppTVar26;
      if (0 < (int)uVar29) {
        do {
          ppTVar26 = (this->m_contexts).
                     super__Vector_base<deqp::egl::(anonymous_namespace)::TestContext_*,_std::allocator<deqp::egl::(anonymous_namespace)::TestContext_*>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          if (ppTVar25 == local_2e8) {
            ppTVar25 = (pointer)((long)local_2e8 - (long)ppTVar6);
            if (ppTVar25 == (pointer)0x7ffffffffffffff8) {
              std::__throw_length_error("vector::_M_realloc_insert");
            }
            uVar17 = (long)ppTVar25 >> 3;
            uVar14 = 1;
            if (local_2e8 != ppTVar6) {
              uVar14 = uVar17;
            }
            this_02 = (_Vector_base<deqp::egl::(anonymous_namespace)::TestContext_*,_std::allocator<deqp::egl::(anonymous_namespace)::TestContext_*>_>
                       *)(uVar14 + uVar17);
            if ((_Vector_base<deqp::egl::(anonymous_namespace)::TestContext_*,_std::allocator<deqp::egl::(anonymous_namespace)::TestContext_*>_>
                 *)0xffffffffffffffe < this_02) {
              this_02 = (_Vector_base<deqp::egl::(anonymous_namespace)::TestContext_*,_std::allocator<deqp::egl::(anonymous_namespace)::TestContext_*>_>
                         *)0xfffffffffffffff;
            }
            if (CARRY8(uVar14,uVar17)) {
              this_02 = (_Vector_base<deqp::egl::(anonymous_namespace)::TestContext_*,_std::allocator<deqp::egl::(anonymous_namespace)::TestContext_*>_>
                         *)0xfffffffffffffff;
            }
            __dest = std::
                     _Vector_base<deqp::egl::(anonymous_namespace)::TestContext_*,_std::allocator<deqp::egl::(anonymous_namespace)::TestContext_*>_>
                     ::_M_allocate(this_02,(size_t)in_RSI);
            *(TestContext **)((long)__dest + (long)ppTVar25) = ppTVar26[iVar19];
            if (0 < (long)ppTVar25) {
              in_RSI = ppTVar6;
              memmove(__dest,ppTVar6,(size_t)ppTVar25);
            }
            if (ppTVar6 != (pointer)0x0) {
              in_RSI = ppTVar25;
              operator_delete(ppTVar6,(ulong)ppTVar25);
            }
            ppTVar25 = (pointer)((long)ppTVar25 + (long)__dest);
            local_2e8 = __dest + (long)this_02;
          }
          else {
            *ppTVar25 = ppTVar26[iVar19];
            __dest = ppTVar6;
          }
          ppTVar25 = ppTVar25 + 1;
          iVar19 = iVar19 + 1;
          uVar29 = uVar29 - 1;
          ppTVar6 = __dest;
        } while (uVar29 != 0);
      }
      pTVar5 = (TestContext *)operator_new(0x88);
      __n = (pointer)((long)ppTVar25 - (long)__dest);
      ppTVar6 = std::
                _Vector_base<deqp::egl::(anonymous_namespace)::TestContext_*,_std::allocator<deqp::egl::(anonymous_namespace)::TestContext_*>_>
                ::_M_allocate((_Vector_base<deqp::egl::(anonymous_namespace)::TestContext_*,_std::allocator<deqp::egl::(anonymous_namespace)::TestContext_*>_>
                               *)((long)__n >> 3),(size_t)in_RSI);
      if (ppTVar25 != __dest) {
        in_RSI = __dest;
        memmove(ppTVar6,__dest,(size_t)__n);
      }
      de::Thread::Thread((Thread *)pTVar5);
      pTVar5->m_parent = (TestContext *)&PTR__TestThread_0211a318;
      (pTVar5->m_config).frameCount = 0;
      (pTVar5->m_config).drawCallCount = 0;
      (pTVar5->m_config).triangleCount = 0;
      (pTVar5->m_config).sharedContexts = false;
      (pTVar5->m_config).useCoordBuffer = false;
      (pTVar5->m_config).sharedCoordBuffer = false;
      (pTVar5->m_config).useIndices = false;
      (pTVar5->m_config).useIndexBuffer = false;
      (pTVar5->m_config).sharedIndexBuffer = false;
      (pTVar5->m_config).useTexture = false;
      (pTVar5->m_config).field_0x1b = 0;
      (pTVar5->m_config).textureType = TEXTURETYPE_TEXTURE;
      ppTVar7 = std::
                _Vector_base<deqp::egl::(anonymous_namespace)::TestContext_*,_std::allocator<deqp::egl::(anonymous_namespace)::TestContext_*>_>
                ::_M_allocate((_Vector_base<deqp::egl::(anonymous_namespace)::TestContext_*,_std::allocator<deqp::egl::(anonymous_namespace)::TestContext_*>_>
                               *)((long)__n >> 3),(size_t)in_RSI);
      uVar29 = local_298;
      ppTVar26 = local_2a8;
      *(pointer *)&(pTVar5->m_config).frameCount = ppTVar7;
      *(pointer *)&(pTVar5->m_config).triangleCount = ppTVar7;
      *(undefined **)&(pTVar5->m_config).useIndexBuffer = (undefined *)((long)ppTVar7 + (long)__n);
      if (ppTVar25 != __dest) {
        in_RSI = ppTVar6;
        memcpy(ppTVar7,ppTVar6,(size_t)__n);
      }
      *(undefined **)&(pTVar5->m_config).triangleCount = (undefined *)((long)ppTVar7 + (long)__n);
      (pTVar5->m_config).sharedProgram = false;
      *(EGLDisplay **)&(pTVar5->m_config).textureHeight = &pTVar5->m_eglDisplay;
      *(undefined8 *)&(pTVar5->m_config).surfaceHeight = 0;
      *(undefined1 *)&pTVar5->m_eglDisplay = 0;
      pTVar5->m_eglSurface = (EGLSurface)0x0;
      (pTVar5->m_gl).activeShaderProgram = (glActiveShaderProgramFunc)0x0;
      (pTVar5->m_gl).activeTexture = (glActiveTextureFunc)0x0;
      (pTVar5->m_gl).attachShader = (glAttachShaderFunc)0x0;
      (pTVar5->m_gl).beginConditionalRender = (glBeginConditionalRenderFunc)0x0;
      (pTVar5->m_gl).beginQuery = (glBeginQueryFunc)0x0;
      if (ppTVar26 == local_2f8) {
        ppTVar25 = (pointer)((long)ppTVar26 - (long)local_310);
        if (ppTVar25 == (pointer)0x7ffffffffffffff8) {
          std::__throw_length_error("vector::_M_realloc_insert");
        }
        uVar14 = (long)ppTVar25 >> 3;
        uVar29 = uVar14;
        if (ppTVar26 == local_310) {
          uVar29 = 1;
        }
        local_2b0 = uVar29 + uVar14;
        if (0xffffffffffffffe < local_2b0) {
          local_2b0 = 0xfffffffffffffff;
        }
        if (CARRY8(uVar29,uVar14)) {
          local_2b0 = 0xfffffffffffffff;
        }
        if (local_2b0 == 0) {
          ppTVar7 = (pointer)0x0;
        }
        else {
          ppTVar7 = (pointer)operator_new(local_2b0 * 8);
        }
        ppTVar7[uVar14] = pTVar5;
        if (0 < (long)ppTVar25) {
          in_RSI = local_310;
          memmove(ppTVar7,local_310,(size_t)ppTVar25);
        }
        uVar29 = local_298;
        if (local_310 != (pointer)0x0) {
          in_RSI = ppTVar25;
          operator_delete(local_310,(ulong)ppTVar25);
        }
        ppTVar26 = (pointer)((long)ppTVar25 + (long)ppTVar7);
        local_2f8 = ppTVar7 + local_2b0;
        local_310 = ppTVar7;
      }
      else {
        *ppTVar26 = pTVar5;
      }
      if (ppTVar6 != (pointer)0x0) {
        operator_delete(ppTVar6,(ulong)__n);
        in_RSI = __n;
      }
      ppTVar26 = ppTVar26 + 1;
      iVar24 = iVar24 + 1;
      iVar28 = iVar28 + (int)uVar29;
      ppTVar25 = __dest;
    } while (iVar24 != local_29c);
    if (__dest != (pointer)0x0) {
      operator_delete(__dest,(long)local_2e8 - (long)__dest);
    }
  }
  dVar8 = deGetMicroseconds();
  uVar15 = (uint)((ulong)((long)ppTVar26 - (long)local_310) >> 3);
  if (0 < (int)uVar15) {
    lVar20 = 1;
    if (1 < (long)(int)uVar15) {
      lVar20 = (long)(int)uVar15;
    }
    lVar23 = 0;
    do {
      pTVar5 = local_310[lVar23];
      p_Var9 = (glBeginConditionalRenderFunc)deGetMicroseconds();
      (pTVar5->m_gl).beginConditionalRender = p_Var9;
      de::Thread::start((Thread *)pTVar5);
      p_Var10 = (glBeginQueryFunc)deGetMicroseconds();
      (pTVar5->m_gl).beginQuery = p_Var10;
      lVar23 = lVar23 + 1;
    } while (lVar20 != lVar23);
    lVar23 = 0;
    do {
      pTVar5 = local_310[lVar23];
      p_Var11 = (glActiveTextureFunc)deGetMicroseconds();
      (pTVar5->m_gl).activeTexture = p_Var11;
      de::Thread::join((Thread *)pTVar5);
      p_Var12 = (glAttachShaderFunc)deGetMicroseconds();
      (pTVar5->m_gl).attachShader = p_Var12;
      lVar23 = lVar23 + 1;
    } while (lVar20 != lVar23);
  }
  dVar13 = deGetMicroseconds();
  if ((int)uVar15 < 1) {
LAB_00e2a2af:
    local_230 = (undefined1  [8])(dVar13 - dVar8);
    __position._M_current =
         (this->m_results).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
         .super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->m_results).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_realloc_insert<unsigned_long>
                (&this->m_results,__position,(unsigned_long *)local_230);
      puVar22 = (this->m_results).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    }
    else {
      *__position._M_current = (unsigned_long)local_230;
      puVar22 = __position._M_current + 1;
      (this->m_results).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = puVar22;
    }
    IVar18 = CONTINUE;
    if (this->m_iterationCount ==
        (int)((ulong)((long)puVar22 -
                     (long)(this->m_results).
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_start) >> 3)) {
      this_00 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
      paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)this_00->m_log;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                (&local_2c8,&this->m_results);
      local_b0.field_2._M_allocated_capacity._0_4_ = 0x75736552;
      local_b0.field_2._M_allocated_capacity._4_2_ = 0x746c;
      local_b0._M_string_length = 6;
      local_b0.field_2._M_local_buf[6] = '\0';
      local_290.field_2._M_allocated_capacity._0_4_ = 0x75736552;
      local_290.field_2._M_allocated_capacity._4_2_ = 0x746c;
      local_290._M_string_length = 6;
      local_290.field_2._M_local_buf[6] = '\0';
      local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      tcu::LogSampleList::LogSampleList(&local_270,&local_b0,&local_290);
      tcu::TestLog::startSampleList
                ((TestLog *)&paVar2->_M_allocated_capacity,&local_270.m_name,
                 &local_270.m_description);
      tcu::TestLog::startSampleInfo((TestLog *)&paVar2->_M_allocated_capacity);
      local_50.field_2._M_allocated_capacity._0_4_ = 0x656d6954;
      local_50._M_string_length = 4;
      local_50.field_2._M_allocated_capacity._4_4_ =
           local_50.field_2._M_allocated_capacity._4_4_ & 0xffffff00;
      local_70.field_2._M_allocated_capacity._0_4_ = 0x656d6954;
      local_70._M_string_length = 4;
      local_70.field_2._M_allocated_capacity._4_4_ =
           local_70.field_2._M_allocated_capacity._4_4_ & 0xffffff00;
      local_90.field_2._M_allocated_capacity._0_2_ = 0x7375;
      local_90._M_string_length = 2;
      local_90.field_2._M_local_buf[2] = '\0';
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      tcu::LogValueInfo::LogValueInfo
                ((LogValueInfo *)local_230,&local_50,&local_70,&local_90,
                 QP_SAMPLE_VALUE_TAG_RESPONSE);
      tcu::TestLog::writeValueInfo
                ((TestLog *)&paVar2->_M_allocated_capacity,(string *)local_230,&local_210,&local_1f0
                 ,local_1d0);
      tcu::TestLog::endSampleInfo((TestLog *)&paVar2->_M_allocated_capacity);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
        operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_210._M_dataplus._M_p != &local_210.field_2) {
        operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
      }
      if (local_230 != (undefined1  [8])&aStack_220) {
        operator_delete((void *)local_230,aStack_220._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,
                        CONCAT53(local_90.field_2._M_allocated_capacity._3_5_,
                                 CONCAT12(local_90.field_2._M_local_buf[2],
                                          local_90.field_2._M_allocated_capacity._0_2_)) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,
                        CONCAT44(local_70.field_2._M_allocated_capacity._4_4_,
                                 local_70.field_2._M_allocated_capacity._0_4_) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,
                        CONCAT44(local_50.field_2._M_allocated_capacity._4_4_,
                                 local_50.field_2._M_allocated_capacity._0_4_) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_270.m_description._M_dataplus._M_p != &local_270.m_description.field_2) {
        operator_delete(local_270.m_description._M_dataplus._M_p,
                        local_270.m_description.field_2._M_allocated_capacity + 1);
      }
      paVar1 = &local_270.m_name.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_270.m_name._M_dataplus._M_p != paVar1) {
        operator_delete(local_270.m_name._M_dataplus._M_p,
                        (ulong)(local_270.m_name.field_2._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_290._M_dataplus._M_p != &local_290.field_2) {
        operator_delete(local_290._M_dataplus._M_p,
                        CONCAT17(local_290.field_2._M_local_buf[7],
                                 CONCAT16(local_290.field_2._M_local_buf[6],
                                          CONCAT24(local_290.field_2._M_allocated_capacity._4_2_,
                                                   local_290.field_2._M_allocated_capacity._0_4_)))
                        + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p,
                        CONCAT17(local_b0.field_2._M_local_buf[7],
                                 CONCAT16(local_b0.field_2._M_local_buf[6],
                                          CONCAT24(local_b0.field_2._M_allocated_capacity._4_2_,
                                                   local_b0.field_2._M_allocated_capacity._0_4_))) +
                        1);
      }
      if (0 < (int)((ulong)((long)local_2c8.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_finish -
                           (long)local_2c8.
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_start) >> 3)) {
        lVar20 = 0;
        do {
          local_228 = (pointer)0x0;
          aStack_220._M_allocated_capacity = 0;
          aStack_220._8_8_ = 0;
          local_230 = (undefined1  [8])paVar2;
          this_01 = tcu::SampleBuilder::operator<<
                              ((SampleBuilder *)local_230,
                               local_2c8.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_start[lVar20]);
          tcu::SampleBuilder::operator<<(this_01,(EndSampleToken *)&tcu::TestLog::EndSample);
          if (local_228 != (pointer)0x0) {
            operator_delete(local_228,aStack_220._8_8_ - (long)local_228);
          }
          lVar20 = lVar20 + 1;
        } while (lVar20 < (int)((ulong)((long)local_2c8.
                                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                              ._M_impl.super__Vector_impl_data._M_finish -
                                       (long)local_2c8.
                                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                             ._M_impl.super__Vector_impl_data._M_start) >> 3));
      }
      tcu::TestLog::endSampleList((TestLog *)&paVar2->_M_allocated_capacity);
      puVar4 = local_2c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish;
      puVar16 = local_2c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start;
      if (local_2c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start !=
          local_2c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        uVar29 = (long)local_2c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)local_2c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_start >> 3;
        lVar20 = 0x3f;
        if (uVar29 != 0) {
          for (; uVar29 >> lVar20 == 0; lVar20 = lVar20 + -1) {
          }
        }
        std::
        __introsort_loop<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                  (local_2c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_start,
                   local_2c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_finish,((uint)lVar20 ^ 0x3f) * 2 ^ 0x7e);
        std::
        __final_insertion_sort<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_less_iter>
                  (puVar16,puVar4);
        puVar16 = local_2c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
      }
      uVar29 = (long)puVar16 -
               (long)local_2c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_start >> 3;
      uVar15 = (uint)uVar29;
      if ((int)uVar15 < 1) {
        uVar27 = *(undefined8 *)
                  ((long)local_2c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                         ._M_impl.super__Vector_impl_data._M_start +
                  (uVar29 & 0xfffffffffffffffe) * 4);
        dVar31 = 0.0;
        local_2e8 = (pointer)0x0;
      }
      else {
        uVar17 = 0;
        uVar14 = 0;
        do {
          uVar14 = uVar14 + local_2c8.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start[uVar17];
          uVar17 = uVar17 + 1;
        } while ((uVar15 & 0x7fffffff) != uVar17);
        uVar17 = 0;
        uVar14 = uVar14 / uVar29;
        uVar27 = *(undefined8 *)
                  ((long)local_2c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                         ._M_impl.super__Vector_impl_data._M_start +
                  (uVar29 & 0xfffffffffffffffe) * 4);
        dVar31 = 0.0;
        do {
          lVar20 = (local_2c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start[uVar17] - uVar14) *
                   (local_2c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start[uVar17] - uVar14);
          auVar36._8_4_ = (int)((ulong)lVar20 >> 0x20);
          auVar36._0_8_ = lVar20;
          auVar36._12_4_ = 0x45300000;
          dVar31 = dVar31 + (auVar36._8_8_ - 1.9342813113834067e+25) +
                            ((double)CONCAT44(0x43300000,(int)lVar20) - 4503599627370496.0);
          uVar17 = uVar17 + 1;
        } while ((uVar15 & 0x7fffffff) != uVar17);
        auVar33._8_4_ = (int)(uVar14 >> 0x20);
        auVar33._0_8_ = uVar14;
        auVar33._12_4_ = 0x45300000;
        local_2e8 = (pointer)((auVar33._8_8_ - 1.9342813113834067e+25) +
                             ((double)CONCAT44(0x43300000,(int)uVar14) - 4503599627370496.0));
      }
      auVar34._8_4_ =
           (int)((long)puVar16 -
                 (long)local_2c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_start >> 0x23);
      auVar34._0_8_ = uVar29;
      auVar34._12_4_ = 0x45300000;
      dVar31 = dVar31 / ((auVar34._8_8_ - 1.9342813113834067e+25) +
                        ((double)CONCAT44(0x43300000,uVar15) - 4503599627370496.0));
      if (dVar31 < 0.0) {
        dVar31 = sqrt(dVar31);
      }
      else {
        dVar31 = SQRT(dVar31);
      }
      local_270.m_name._M_dataplus._M_p = (pointer)0x17;
      local_230 = (undefined1  [8])&aStack_220;
      local_230 = (undefined1  [8])
                  std::__cxx11::string::_M_create((ulong *)local_230,(ulong)&local_270);
      aStack_220._M_allocated_capacity = (size_type)local_270.m_name._M_dataplus._M_p;
      *(undefined8 *)local_230 = 0x6974736974617453;
      ((TestLog *)((long)local_230 + 8))->m_log = (qpTestLog *)0x206d6f7266207363;
      builtin_strncpy((char *)((long)&((TestLog *)((long)local_230 + 8))->m_log + 7)," results",8);
      local_228 = (pointer)local_270.m_name._M_dataplus._M_p;
      local_270.m_name._M_dataplus._M_p[(long)local_230] = '\0';
      local_b0._M_dataplus._M_p = (pointer)0x17;
      local_270.m_name._M_dataplus._M_p = (pointer)paVar1;
      local_270.m_name._M_dataplus._M_p =
           (pointer)std::__cxx11::string::_M_create((ulong *)&local_270,(ulong)&local_b0);
      local_270.m_name.field_2._M_allocated_capacity = (size_type)local_b0._M_dataplus._M_p;
      builtin_strncpy(local_270.m_name._M_dataplus._M_p,"Statistics from results",0x17);
      local_270.m_name._M_string_length = (size_type)local_b0._M_dataplus._M_p;
      local_270.m_name._M_dataplus._M_p[(long)local_b0._M_dataplus._M_p] = '\0';
      tcu::ScopedLogSection::ScopedLogSection
                ((ScopedLogSection *)&local_290,(TestLog *)&paVar2->_M_allocated_capacity,
                 (string *)local_230,&local_270.m_name);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_270.m_name._M_dataplus._M_p != paVar1) {
        operator_delete(local_270.m_name._M_dataplus._M_p,
                        (ulong)(local_270.m_name.field_2._M_allocated_capacity + 1));
      }
      if (local_230 != (undefined1  [8])&aStack_220) {
        operator_delete((void *)local_230,aStack_220._M_allocated_capacity + 1);
      }
      local_230 = (undefined1  [8])paVar2;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_228);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_228,"Average: ",9);
      std::ostream::_M_insert<double>((double)local_2e8 / 1000.0);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_228,"ms\n",3);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_228,"Standard deviation: ",0x14);
      std::ostream::_M_insert<double>(dVar31 / 1000.0);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_228,"ms\n",3);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_228,"Standard error of mean: ",0x18);
      lVar20 = (long)local_2c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)local_2c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_start >> 3;
      auVar32._8_4_ =
           (int)((long)local_2c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)local_2c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_start >> 0x23);
      auVar32._0_8_ = lVar20;
      auVar32._12_4_ = 0x45300000;
      std::ostream::_M_insert<double>
                ((dVar31 / SQRT((auVar32._8_8_ - 1.9342813113834067e+25) +
                                ((double)CONCAT44(0x43300000,(int)lVar20) - 4503599627370496.0))) /
                 1000.0);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_228,"ms\n",3);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_228,"Median: ",8);
      auVar35._8_4_ = (int)((ulong)uVar27 >> 0x20);
      auVar35._0_8_ = uVar27;
      auVar35._12_4_ = 0x45300000;
      std::ostream::_M_insert<double>
                (((auVar35._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)uVar27) - 4503599627370496.0)) / 1000.0);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_228,"ms\n",3);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_230,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_228);
      std::ios_base::~ios_base(local_1b8);
      tcu::TestLog::endSection((TestLog *)local_290._M_dataplus._M_p);
      de::floatToString_abi_cxx11_
                ((string *)local_230,(de *)0x2,(float)((double)local_2e8 / 1000.0),precision);
      tcu::TestContext::setTestResult(this_00,QP_TEST_RESULT_PASS,(char *)local_230);
      if (local_230 != (undefined1  [8])&aStack_220) {
        operator_delete((void *)local_230,aStack_220._M_allocated_capacity + 1);
      }
      if (local_2c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_2c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_2c8.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_2c8.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      IVar18 = STOP;
    }
    if (local_310 == (pointer)0x0) {
      return IVar18;
    }
  }
  else {
    if (((*local_310)->m_config).sharedProgram == true) {
      uVar29 = 1;
      do {
        uVar14 = uVar29;
        if ((uVar15 & 0x7fffffff) == uVar14) break;
        uVar29 = uVar14 + 1;
      } while ((local_310[uVar14]->m_config).sharedProgram != false);
      if ((uVar15 & 0x7fffffff) <= uVar14) {
        lVar20 = 1;
        if (1 < (long)(int)uVar15) {
          lVar20 = (long)(int)uVar15;
        }
        lVar23 = 0;
        do {
          if (local_310[lVar23] != (TestContext *)0x0) {
            (*(code *)local_310[lVar23]->m_parent->m_testCtx)();
          }
          local_310[lVar23] = (TestContext *)0x0;
          lVar23 = lVar23 + 1;
        } while (lVar20 != lVar23);
        goto LAB_00e2a2af;
      }
    }
    IVar18 = STOP;
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
               "Fail");
  }
  operator_delete(local_310,(long)local_2f8 - (long)local_310);
  return IVar18;
}

Assistant:

TestCase::IterateResult SharedRenderingPerfCase::iterate (void)
{
	deUint64			beginTimeUs;
	deUint64			endTimeUs;
	vector<TestThread*>	threads;

	if (m_results.empty())
		logTestConfig(m_testCtx.getLog(), m_config);

	createThreads(threads, m_config.threadCount, m_config.perThreadContextCount, m_contexts);

	beginTimeUs = deGetMicroseconds();

	startThreads(threads);
	joinThreads(threads);

	endTimeUs = deGetMicroseconds();

	if (!threadResultsOk(threads))
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
		return STOP;
	}

	destroyThreads(threads);

	m_results.push_back(endTimeUs - beginTimeUs);

	if ((int)m_results.size() == m_iterationCount)
	{
		logAndSetResults(m_testCtx, m_results);
		return STOP;
	}
	else
		return CONTINUE;
}